

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O0

void __thiscall
icu_63::CollationIterator::appendCEsFromCE32
          (CollationIterator *this,CollationData *d,UChar32 c,uint32_t ce32,UBool forward,
          UErrorCode *errorCode)

{
  UChar *pUVar1;
  uint32_t *puVar2;
  UBool UVar3;
  int32_t iVar4;
  uint uVar5;
  uint32_t ce32_00;
  int iVar6;
  int64_t iVar7;
  int iVar8;
  int iVar9;
  UChar trail;
  UChar32 v;
  UChar32 t;
  uint32_t *jamoCE32s;
  UChar32 nextCp;
  uint32_t defaultCE32;
  UChar *p;
  int64_t *piStack_48;
  int32_t length_1;
  int64_t *ces;
  uint32_t *puStack_38;
  int32_t length;
  uint32_t *ce32s;
  UErrorCode *errorCode_local;
  uint32_t local_20;
  uint uStack_1c;
  UBool forward_local;
  uint32_t ce32_local;
  UChar32 c_local;
  CollationData *d_local;
  CollationIterator *this_local;
  
  ce32_00 = ce32;
  uStack_1c = c;
  _ce32_local = d;
  do {
    local_20 = ce32_00;
    UVar3 = Collation::isSpecialCE32(local_20);
    if (UVar3 == '\0') {
      iVar7 = Collation::ceFromSimpleCE32(local_20);
      CEBuffer::append(&this->ceBuffer,iVar7,errorCode);
      return;
    }
    iVar4 = Collation::tagFromCE32(local_20);
    ce32_00 = local_20;
    switch(iVar4) {
    case 0:
    case 3:
      UVar3 = ::U_SUCCESS(*errorCode);
      if (UVar3 != '\0') {
        *errorCode = U_INTERNAL_PROGRAM_ERROR;
      }
      return;
    case 1:
      iVar7 = Collation::ceFromLongPrimaryCE32(local_20);
      CEBuffer::append(&this->ceBuffer,iVar7,errorCode);
      return;
    case 2:
      iVar7 = Collation::ceFromLongSecondaryCE32(local_20);
      CEBuffer::append(&this->ceBuffer,iVar7,errorCode);
      return;
    case 4:
      UVar3 = CEBuffer::ensureAppendCapacity(&this->ceBuffer,2,errorCode);
      if (UVar3 == '\0') {
        return;
      }
      iVar4 = (this->ceBuffer).length;
      iVar7 = Collation::latinCE0FromCE32(local_20);
      CEBuffer::set(&this->ceBuffer,iVar4,iVar7);
      iVar6 = (this->ceBuffer).length;
      iVar7 = Collation::latinCE1FromCE32(local_20);
      CEBuffer::set(&this->ceBuffer,iVar6 + 1,iVar7);
      (this->ceBuffer).length = (this->ceBuffer).length + 2;
      return;
    case 5:
      puStack_38 = _ce32_local->ce32s;
      iVar4 = Collation::indexFromCE32(local_20);
      puStack_38 = puStack_38 + iVar4;
      ces._4_4_ = Collation::lengthFromCE32(local_20);
      UVar3 = CEBuffer::ensureAppendCapacity(&this->ceBuffer,ces._4_4_,errorCode);
      if (UVar3 == '\0') {
        return;
      }
      do {
        iVar7 = Collation::ceFromCE32(*puStack_38);
        CEBuffer::appendUnsafe(&this->ceBuffer,iVar7);
        ces._4_4_ = ces._4_4_ + -1;
        puStack_38 = puStack_38 + 1;
      } while (0 < ces._4_4_);
      return;
    case 6:
      piStack_48 = _ce32_local->ces;
      iVar4 = Collation::indexFromCE32(local_20);
      piStack_48 = piStack_48 + iVar4;
      p._4_4_ = Collation::lengthFromCE32(local_20);
      UVar3 = CEBuffer::ensureAppendCapacity(&this->ceBuffer,p._4_4_,errorCode);
      if (UVar3 == '\0') {
        return;
      }
      do {
        CEBuffer::appendUnsafe(&this->ceBuffer,*piStack_48);
        p._4_4_ = p._4_4_ + -1;
        piStack_48 = piStack_48 + 1;
      } while (0 < p._4_4_);
      return;
    case 7:
      ce32_00 = (*(this->super_UObject)._vptr_UObject[0xf])(this,(ulong)local_20,errorCode);
      UVar3 = ::U_FAILURE(*errorCode);
      if (UVar3 != '\0') {
        return;
      }
      if (ce32_00 == 0xc0) {
        _ce32_local = this->data->base;
        ce32_00 = CollationData::getCE32(_ce32_local,uStack_1c);
      }
      break;
    case 8:
      if (forward != '\0') {
        (*(this->super_UObject)._vptr_UObject[0xd])(this,1,errorCode);
      }
      ce32_00 = getCE32FromPrefix(this,_ce32_local,local_20,errorCode);
      if (forward != '\0') {
        (*(this->super_UObject)._vptr_UObject[0xc])(this,1,errorCode);
      }
      break;
    case 9:
      pUVar1 = _ce32_local->contexts;
      iVar4 = Collation::indexFromCE32(local_20);
      ce32_00 = CollationData::readCE32(pUVar1 + iVar4);
      if (forward != '\0') {
        if ((this->skipped == (SkippedState *)0x0) && (this->numCpFwd < 0)) {
          jamoCE32s._0_4_ = (*(this->super_UObject)._vptr_UObject[6])(this,errorCode);
          if ((UChar32)jamoCE32s < 0) break;
          if (((local_20 & 0x200) != 0) &&
             (UVar3 = CollationFCD::mayHaveLccc((UChar32)jamoCE32s), UVar3 == '\0')) {
            (*(this->super_UObject)._vptr_UObject[0xd])(this,1,errorCode);
            break;
          }
        }
        else {
          jamoCE32s._0_4_ = nextSkippedCodePoint(this,errorCode);
          if ((UChar32)jamoCE32s < 0) break;
          if (((local_20 & 0x200) != 0) &&
             (UVar3 = CollationFCD::mayHaveLccc((UChar32)jamoCE32s), UVar3 == '\0')) {
            backwardNumSkipped(this,1,errorCode);
            break;
          }
        }
        ce32_00 = nextCE32FromContraction
                            (this,_ce32_local,local_20,pUVar1 + iVar4 + 2,ce32_00,(UChar32)jamoCE32s
                             ,errorCode);
        if (ce32_00 == 1) {
          return;
        }
        break;
      }
      break;
    case 10:
      if (this->isNumeric != '\0') {
        appendNumericCEs(this,local_20,forward,errorCode);
        return;
      }
      puVar2 = _ce32_local->ce32s;
      iVar4 = Collation::indexFromCE32(local_20);
      ce32_00 = puVar2[iVar4];
      break;
    case 0xb:
      if ((forward != '\0') &&
         (iVar6 = (*(this->super_UObject)._vptr_UObject[10])(), (char)iVar6 != '\0')) {
        CEBuffer::append(&this->ceBuffer,0x101000100,errorCode);
        return;
      }
      ce32_00 = *_ce32_local->ce32s;
      break;
    case 0xc:
      puVar2 = _ce32_local->jamoCE32s;
      iVar8 = (int)(uStack_1c - 0xac00) % 0x1c;
      iVar6 = (int)(uStack_1c - 0xac00) / 0x1c;
      iVar9 = iVar6 % 0x15;
      iVar6 = iVar6 / 0x15;
      if ((local_20 & 0x100) != 0) {
        iVar4 = 3;
        if (iVar8 == 0) {
          iVar4 = 2;
        }
        UVar3 = CEBuffer::ensureAppendCapacity(&this->ceBuffer,iVar4,errorCode);
        if (UVar3 == '\0') {
          return;
        }
        iVar4 = (this->ceBuffer).length;
        iVar7 = Collation::ceFromCE32(puVar2[iVar6]);
        CEBuffer::set(&this->ceBuffer,iVar4,iVar7);
        iVar6 = (this->ceBuffer).length;
        iVar7 = Collation::ceFromCE32(puVar2[iVar9 + 0x13]);
        CEBuffer::set(&this->ceBuffer,iVar6 + 1,iVar7);
        (this->ceBuffer).length = (this->ceBuffer).length + 2;
        if (iVar8 == 0) {
          return;
        }
        iVar7 = Collation::ceFromCE32(puVar2[iVar8 + 0x27]);
        CEBuffer::appendUnsafe(&this->ceBuffer,iVar7);
        return;
      }
      appendCEsFromCE32(this,_ce32_local,-1,puVar2[iVar6],forward,errorCode);
      appendCEsFromCE32(this,_ce32_local,-1,puVar2[iVar9 + 0x13],forward,errorCode);
      if (iVar8 == 0) {
        return;
      }
      uStack_1c = 0xffffffff;
      ce32_00 = puVar2[iVar8 + 0x27];
      break;
    case 0xd:
      uVar5 = (*(this->super_UObject)._vptr_UObject[9])();
      if ((uVar5 & 0xfc00) == 0xdc00) {
        uStack_1c = uStack_1c * 0x400 + (uVar5 & 0xffff) + 0xfca02400;
        if ((local_20 & 0x300) == 0) {
          local_20 = 0xffffffff;
          ce32_00 = local_20;
        }
        else if (((local_20 & 0x300) == 0x100) ||
                (ce32_00 = CollationData::getCE32FromSupplementary(_ce32_local,uStack_1c),
                ce32_00 == 0xc0)) {
          _ce32_local = _ce32_local->base;
          ce32_00 = CollationData::getCE32FromSupplementary(_ce32_local,uStack_1c);
        }
      }
      else {
        local_20 = 0xffffffff;
        ce32_00 = local_20;
      }
      break;
    case 0xe:
      iVar7 = CollationData::getCEFromOffsetCE32(_ce32_local,uStack_1c,local_20);
      CEBuffer::append(&this->ceBuffer,iVar7,errorCode);
      return;
    case 0xf:
      if (((uStack_1c & 0xfffff800) != 0xd800) ||
         (iVar6 = (*(this->super_UObject)._vptr_UObject[0xb])(), (char)iVar6 == '\0')) {
        iVar7 = Collation::unassignedCEFromCodePoint(uStack_1c);
        CEBuffer::append(&this->ceBuffer,iVar7,errorCode);
        return;
      }
      local_20 = 0xfffd0505;
      ce32_00 = local_20;
    }
  } while( true );
}

Assistant:

void
CollationIterator::appendCEsFromCE32(const CollationData *d, UChar32 c, uint32_t ce32,
                                     UBool forward, UErrorCode &errorCode) {
    while(Collation::isSpecialCE32(ce32)) {
        switch(Collation::tagFromCE32(ce32)) {
        case Collation::FALLBACK_TAG:
        case Collation::RESERVED_TAG_3:
            if(U_SUCCESS(errorCode)) { errorCode = U_INTERNAL_PROGRAM_ERROR; }
            return;
        case Collation::LONG_PRIMARY_TAG:
            ceBuffer.append(Collation::ceFromLongPrimaryCE32(ce32), errorCode);
            return;
        case Collation::LONG_SECONDARY_TAG:
            ceBuffer.append(Collation::ceFromLongSecondaryCE32(ce32), errorCode);
            return;
        case Collation::LATIN_EXPANSION_TAG:
            if(ceBuffer.ensureAppendCapacity(2, errorCode)) {
                ceBuffer.set(ceBuffer.length, Collation::latinCE0FromCE32(ce32));
                ceBuffer.set(ceBuffer.length + 1, Collation::latinCE1FromCE32(ce32));
                ceBuffer.length += 2;
            }
            return;
        case Collation::EXPANSION32_TAG: {
            const uint32_t *ce32s = d->ce32s + Collation::indexFromCE32(ce32);
            int32_t length = Collation::lengthFromCE32(ce32);
            if(ceBuffer.ensureAppendCapacity(length, errorCode)) {
                do {
                    ceBuffer.appendUnsafe(Collation::ceFromCE32(*ce32s++));
                } while(--length > 0);
            }
            return;
        }
        case Collation::EXPANSION_TAG: {
            const int64_t *ces = d->ces + Collation::indexFromCE32(ce32);
            int32_t length = Collation::lengthFromCE32(ce32);
            if(ceBuffer.ensureAppendCapacity(length, errorCode)) {
                do {
                    ceBuffer.appendUnsafe(*ces++);
                } while(--length > 0);
            }
            return;
        }
        case Collation::BUILDER_DATA_TAG:
            ce32 = getCE32FromBuilderData(ce32, errorCode);
            if(U_FAILURE(errorCode)) { return; }
            if(ce32 == Collation::FALLBACK_CE32) {
                d = data->base;
                ce32 = d->getCE32(c);
            }
            break;
        case Collation::PREFIX_TAG:
            if(forward) { backwardNumCodePoints(1, errorCode); }
            ce32 = getCE32FromPrefix(d, ce32, errorCode);
            if(forward) { forwardNumCodePoints(1, errorCode); }
            break;
        case Collation::CONTRACTION_TAG: {
            const UChar *p = d->contexts + Collation::indexFromCE32(ce32);
            uint32_t defaultCE32 = CollationData::readCE32(p);  // Default if no suffix match.
            if(!forward) {
                // Backward contractions are handled by previousCEUnsafe().
                // c has contractions but they were not found.
                ce32 = defaultCE32;
                break;
            }
            UChar32 nextCp;
            if(skipped == NULL && numCpFwd < 0) {
                // Some portion of nextCE32FromContraction() pulled out here as an ASCII fast path,
                // avoiding the function call and the nextSkippedCodePoint() overhead.
                nextCp = nextCodePoint(errorCode);
                if(nextCp < 0) {
                    // No more text.
                    ce32 = defaultCE32;
                    break;
                } else if((ce32 & Collation::CONTRACT_NEXT_CCC) != 0 &&
                        !CollationFCD::mayHaveLccc(nextCp)) {
                    // All contraction suffixes start with characters with lccc!=0
                    // but the next code point has lccc==0.
                    backwardNumCodePoints(1, errorCode);
                    ce32 = defaultCE32;
                    break;
                }
            } else {
                nextCp = nextSkippedCodePoint(errorCode);
                if(nextCp < 0) {
                    // No more text.
                    ce32 = defaultCE32;
                    break;
                } else if((ce32 & Collation::CONTRACT_NEXT_CCC) != 0 &&
                        !CollationFCD::mayHaveLccc(nextCp)) {
                    // All contraction suffixes start with characters with lccc!=0
                    // but the next code point has lccc==0.
                    backwardNumSkipped(1, errorCode);
                    ce32 = defaultCE32;
                    break;
                }
            }
            ce32 = nextCE32FromContraction(d, ce32, p + 2, defaultCE32, nextCp, errorCode);
            if(ce32 == Collation::NO_CE32) {
                // CEs from a discontiguous contraction plus the skipped combining marks
                // have been appended already.
                return;
            }
            break;
        }
        case Collation::DIGIT_TAG:
            if(isNumeric) {
                appendNumericCEs(ce32, forward, errorCode);
                return;
            } else {
                // Fetch the non-numeric-collation CE32 and continue.
                ce32 = d->ce32s[Collation::indexFromCE32(ce32)];
                break;
            }
        case Collation::U0000_TAG:
            U_ASSERT(c == 0);
            if(forward && foundNULTerminator()) {
                // Handle NUL-termination. (Not needed in Java.)
                ceBuffer.append(Collation::NO_CE, errorCode);
                return;
            } else {
                // Fetch the normal ce32 for U+0000 and continue.
                ce32 = d->ce32s[0];
                break;
            }
        case Collation::HANGUL_TAG: {
            const uint32_t *jamoCE32s = d->jamoCE32s;
            c -= Hangul::HANGUL_BASE;
            UChar32 t = c % Hangul::JAMO_T_COUNT;
            c /= Hangul::JAMO_T_COUNT;
            UChar32 v = c % Hangul::JAMO_V_COUNT;
            c /= Hangul::JAMO_V_COUNT;
            if((ce32 & Collation::HANGUL_NO_SPECIAL_JAMO) != 0) {
                // None of the Jamo CE32s are isSpecialCE32().
                // Avoid recursive function calls and per-Jamo tests.
                if(ceBuffer.ensureAppendCapacity(t == 0 ? 2 : 3, errorCode)) {
                    ceBuffer.set(ceBuffer.length, Collation::ceFromCE32(jamoCE32s[c]));
                    ceBuffer.set(ceBuffer.length + 1, Collation::ceFromCE32(jamoCE32s[19 + v]));
                    ceBuffer.length += 2;
                    if(t != 0) {
                        ceBuffer.appendUnsafe(Collation::ceFromCE32(jamoCE32s[39 + t]));
                    }
                }
                return;
            } else {
                // We should not need to compute each Jamo code point.
                // In particular, there should be no offset or implicit ce32.
                appendCEsFromCE32(d, U_SENTINEL, jamoCE32s[c], forward, errorCode);
                appendCEsFromCE32(d, U_SENTINEL, jamoCE32s[19 + v], forward, errorCode);
                if(t == 0) { return; }
                // offset 39 = 19 + 21 - 1:
                // 19 = JAMO_L_COUNT
                // 21 = JAMO_T_COUNT
                // -1 = omit t==0
                ce32 = jamoCE32s[39 + t];
                c = U_SENTINEL;
                break;
            }
        }
        case Collation::LEAD_SURROGATE_TAG: {
            U_ASSERT(forward);  // Backward iteration should never see lead surrogate code _unit_ data.
            U_ASSERT(U16_IS_LEAD(c));
            UChar trail;
            if(U16_IS_TRAIL(trail = handleGetTrailSurrogate())) {
                c = U16_GET_SUPPLEMENTARY(c, trail);
                ce32 &= Collation::LEAD_TYPE_MASK;
                if(ce32 == Collation::LEAD_ALL_UNASSIGNED) {
                    ce32 = Collation::UNASSIGNED_CE32;  // unassigned-implicit
                } else if(ce32 == Collation::LEAD_ALL_FALLBACK ||
                        (ce32 = d->getCE32FromSupplementary(c)) == Collation::FALLBACK_CE32) {
                    // fall back to the base data
                    d = d->base;
                    ce32 = d->getCE32FromSupplementary(c);
                }
            } else {
                // c is an unpaired surrogate.
                ce32 = Collation::UNASSIGNED_CE32;
            }
            break;
        }
        case Collation::OFFSET_TAG:
            U_ASSERT(c >= 0);
            ceBuffer.append(d->getCEFromOffsetCE32(c, ce32), errorCode);
            return;
        case Collation::IMPLICIT_TAG:
            U_ASSERT(c >= 0);
            if(U_IS_SURROGATE(c) && forbidSurrogateCodePoints()) {
                ce32 = Collation::FFFD_CE32;
                break;
            } else {
                ceBuffer.append(Collation::unassignedCEFromCodePoint(c), errorCode);
                return;
            }
        }
    }
    ceBuffer.append(Collation::ceFromSimpleCE32(ce32), errorCode);
}